

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.cc
# Opt level: O0

void __thiscall re2::RE2::Set::~Set(Set *this)

{
  Prog *this_00;
  size_type sVar1;
  reference ppRVar2;
  ulong local_18;
  size_t i;
  Set *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::size(&this->re_);
    if (sVar1 <= local_18) break;
    ppRVar2 = std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::operator[]
                        (&this->re_,local_18);
    Regexp::Decref(*ppRVar2);
    local_18 = local_18 + 1;
  }
  this_00 = this->prog_;
  if (this_00 != (Prog *)0x0) {
    Prog::~Prog(this_00);
    operator_delete(this_00);
  }
  std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::~vector(&this->re_);
  return;
}

Assistant:

RE2::Set::~Set() {
  for (size_t i = 0; i < re_.size(); i++)
    re_[i]->Decref();
  delete prog_;
}